

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O2

TValue * cploop_opt(lua_State *L,lua_CFunction dummy,void *ud)

{
  uint32_t *puVar1;
  byte *pbVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  BCReg BVar8;
  BCReg BVar9;
  jit_State *J;
  SnapEntry *pSVar10;
  SnapEntry *pSVar11;
  bool bVar12;
  TraceError e;
  long lVar13;
  uint uVar14;
  TRef TVar15;
  undefined2 *puVar16;
  SnapEntry *pSVar17;
  ushort uVar18;
  ushort uVar19;
  uint uVar20;
  uint uVar21;
  IRRef IVar22;
  uint uVar23;
  SnapShot *pSVar24;
  SnapEntry *pSVar25;
  IRIns *pIVar26;
  byte bVar27;
  byte bVar28;
  uint uVar29;
  uint uVar30;
  SnapShot *pSVar31;
  ushort uVar32;
  IRRef1 IVar33;
  uint uVar34;
  ulong uVar35;
  uint32_t uVar36;
  ulong uVar37;
  ulong uVar38;
  IRRef ref;
  ulong uVar39;
  SnapShot *pSVar40;
  ulong uVar41;
  SnapShot *pSVar42;
  undefined4 uVar43;
  uint local_10c;
  IRRef1 phi [64];
  
  J = *ud;
  uVar23 = (J->cur).nins;
  *(uint *)((long)ud + 0x10) = uVar23 - 0x8000;
  puVar16 = (undefined2 *)lj_mem_realloc(J->L,(void *)0x0,0,(ulong)(uVar23 - 0x8000) * 2);
  *(undefined2 **)((long)ud + 8) = puVar16;
  *puVar16 = 0x8000;
  (J->fold).ins.field_0.ot = 0x1180;
  (J->fold).ins.field_1.op12 = 0;
  lj_ir_emit(J);
  uVar5 = (J->cur).nsnap;
  uVar34 = (uint)uVar5 * 2 - 2;
  if (J->sizesnap < uVar34) {
    lj_snap_grow_buf_(J,uVar34);
  }
  pSVar40 = (J->cur).snap;
  uVar29 = uVar5 - 1;
  uVar34 = (uint)pSVar40[uVar29].nent * (uVar5 - 2) + (J->cur).nsnapmap * 2;
  if (J->sizesnapmap < uVar34) {
    lj_snap_grow_map_(J,uVar34);
    pSVar40 = (J->cur).snap;
  }
  puVar1 = &(J->cur).nsnapmap;
  uVar34 = pSVar40[uVar29].mapofs;
  pSVar10 = (J->cur).snapmap;
  bVar28 = pSVar40[uVar29].nent;
  pSVar10[(ulong)uVar34 + (ulong)bVar28] = 0xff000000;
  uVar38 = 0;
  pSVar40 = pSVar40 + 1;
  for (uVar39 = 0x8001; local_10c = (uint)uVar38, uVar39 < uVar23; uVar39 = uVar39 + 1) {
    pSVar42 = pSVar40;
    if (pSVar40->ref <= uVar39) {
      pSVar42 = pSVar40 + 1;
      uVar29 = pSVar40->mapofs;
      uVar19 = (J->cur).nsnap;
      pSVar31 = (J->cur).snap + uVar19;
      pSVar24 = pSVar42;
      if (pSVar42 == pSVar31) {
        pSVar24 = (SnapShot *)puVar1;
      }
      uVar7 = pSVar24->mapofs;
      bVar3 = pSVar40->nent;
      bVar27 = pSVar40->nslots;
      if ((char)(J->guardemit).irt < '\0') {
        uVar36 = (J->cur).nsnapmap;
        (J->cur).nsnap = uVar19 + 1;
      }
      else {
        uVar36 = pSVar31[-1].mapofs;
        pSVar31 = pSVar31 + -1;
      }
      pSVar11 = (J->cur).snapmap;
      uVar14 = 0;
      (J->guardemit).irt = '\0';
      pSVar31->mapofs = uVar36;
      pSVar31->ref = (IRRef1)(J->cur).nins;
      pSVar31->mcofs = 0;
      pSVar31->nslots = bVar27;
      pSVar31->topslot = pSVar40->topslot;
      pSVar31->count = '\0';
      uVar35 = (ulong)uVar36;
      uVar41 = 0;
      uVar37 = 0;
      while (uVar14 < bVar3) {
        uVar21 = pSVar11[(ulong)uVar29 + (ulong)uVar14];
        uVar20 = pSVar10[uVar34 + uVar41] >> 0x18;
        uVar30 = uVar21 >> 0x18;
        if (uVar20 < uVar30) {
          pSVar11[uVar35 + uVar37] = pSVar10[uVar34 + uVar41];
          uVar20 = (int)uVar41 + 1;
        }
        else {
          if (0x7fff < (uVar21 & 0xffff)) {
            uVar21 = (uint)(ushort)puVar16[(ulong)(uVar21 & 0xffff) - 0x8000] | uVar21 & 0xfffb0000;
          }
          uVar20 = (int)uVar41 + (uint)(uVar20 == uVar30);
          pSVar11[uVar35 + uVar37] = uVar21;
          uVar14 = uVar14 + 1;
        }
        uVar41 = (ulong)uVar20;
        uVar37 = (ulong)((int)uVar37 + 1);
      }
      while( true ) {
        lVar13 = uVar34 + uVar41;
        if ((uint)bVar27 <= pSVar10[lVar13] >> 0x18) break;
        uVar41 = (ulong)((int)uVar41 + 1);
        pSVar11[uVar35 + uVar37] = pSVar10[lVar13];
        uVar37 = (ulong)((int)uVar37 + 1);
      }
      pSVar31->nent = (uint8_t)uVar37;
      pSVar25 = pSVar11 + uVar35 + uVar37;
      uVar37 = (uVar35 + uVar37) * 4;
      for (pSVar17 = pSVar11 + (ulong)uVar29 + (ulong)(uint)bVar3; pSVar17 < pSVar11 + uVar7;
          pSVar17 = pSVar17 + 1) {
        *pSVar25 = *pSVar17;
        pSVar25 = pSVar25 + 1;
        uVar37 = uVar37 + 4;
      }
      *puVar1 = (uint32_t)(uVar37 >> 2);
    }
    pIVar26 = (J->cur).ir;
    uVar19 = pIVar26[uVar39].field_0.op1;
    uVar18 = uVar19;
    if ((short)uVar19 < 0) {
      uVar18 = puVar16[(ulong)uVar19 - 0x8000];
    }
    uVar6 = *(ushort *)((long)pIVar26 + uVar39 * 8 + 2);
    uVar32 = uVar6;
    if ((short)uVar6 < 0) {
      uVar32 = puVar16[(ulong)uVar6 - 0x8000];
    }
    if ((((lj_ir_mode[*(byte *)((long)pIVar26 + uVar39 * 8 + 5)] & 0x60) == 0) && (uVar18 == uVar19)
        ) && (uVar32 == uVar6)) {
      puVar16[uVar39 - 0x8000] = (short)uVar39;
LAB_001473b1:
      uVar38 = (ulong)local_10c;
    }
    else {
      bVar3 = *(byte *)((long)pIVar26 + uVar39 * 8 + 4);
      (J->fold).ins.field_0.ot = *(ushort *)((long)pIVar26 + uVar39 * 8 + 4) & 0xffbf;
      (J->fold).ins.field_0.op1 = uVar18;
      (J->fold).ins.field_0.op2 = uVar32;
      TVar15 = lj_opt_fold(J);
      uVar29 = TVar15 & 0xffff;
      uVar37 = (ulong)uVar29;
      IVar33 = (IRRef1)TVar15;
      puVar16[uVar39 - 0x8000] = IVar33;
      if (uVar39 == uVar37) goto LAB_001473b1;
      pIVar26 = (J->cur).ir;
      if (uVar23 <= uVar29) {
        if (uVar23 < uVar29 && uVar37 != 0xffff) {
          cVar4 = *(char *)((long)pIVar26 + uVar37 * 8 + 5);
          if (cVar4 == 'I') {
            uVar29 = (uint)*(ushort *)((long)pIVar26 + uVar37 * 8 + 2);
            if (uVar29 != 0x7fff) goto LAB_0014750a;
          }
          else if (cVar4 == '[') {
            uVar29 = (uint)pIVar26[uVar37].field_0.op1;
LAB_0014750a:
            if (uVar29 < uVar23) {
              pIVar26 = pIVar26 + uVar29;
              goto LAB_0014751a;
            }
          }
        }
        goto LAB_001473b1;
      }
      bVar27 = *(byte *)((long)pIVar26 + uVar37 * 8 + 4);
      if ((0x7fff < uVar29) && (2 < (bVar27 & 0x1f) && (char)((bVar27 & 0x40) >> 6) == '\0')) {
        bVar27 = bVar27 | 0x40;
        *(byte *)((long)pIVar26 + uVar37 * 8 + 4) = bVar27;
        if (0x3f < local_10c) goto LAB_0014786a;
        local_10c = local_10c + 1;
        phi[uVar38] = IVar33;
      }
      if (((bVar27 ^ bVar3) & 0x1f) == 0) goto LAB_001473b1;
      uVar29 = bVar3 & 0x1f;
      if (uVar29 - 0x14 < 0xfffffffb) {
        if ((uVar29 != 0xe) || (uVar43 = 0x5b0e01d3, 4 < (bVar27 & 0x1f) - 0xf)) {
LAB_00147875:
          e = LJ_TRERR_TYPEINS;
          goto LAB_0014786c;
        }
      }
      else {
        if ((bVar27 & 0x1f) - 0xf < 5) goto LAB_001473b1;
        uVar43 = 0x5b93326e;
        if ((bVar27 & 0x1f) != 0xe) goto LAB_00147875;
      }
      (J->fold).ins.field_0.op1 = IVar33;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar43;
      TVar15 = lj_opt_fold(J);
      uVar29 = TVar15 & 0xffff;
      puVar16[uVar39 - 0x8000] = (short)TVar15;
      pIVar26 = (IRIns *)((ulong)(uVar29 * 8) + (long)(J->cur).ir);
LAB_0014751a:
      if (uVar29 < 0x8000 || uVar23 <= uVar29) goto LAB_001473b1;
      bVar3 = (byte)(pIVar26->field_0).ot;
      uVar38 = (ulong)local_10c;
      if ((bVar3 & 0x40) == 0) {
        (pIVar26->field_1).t.irt = bVar3 | 0x40;
        if (0x3f < local_10c) goto LAB_0014786a;
        uVar38 = (ulong)(local_10c + 1);
        phi[local_10c] = (IRRef1)uVar29;
      }
    }
    pSVar40 = pSVar42;
  }
  pSVar40 = (J->cur).snap;
  if (-1 < (char)(J->guardemit).irt) {
    uVar19 = (J->cur).nsnap - 1;
    (J->cur).nsnap = uVar19;
    (J->cur).nsnapmap = pSVar40[uVar19].mapofs;
  }
  pSVar10[(ulong)uVar34 + (ulong)bVar28] = (J->cur).snapmap[pSVar40->nent];
  uVar19 = J->chain[0x11];
  uVar39 = 0;
  bVar12 = false;
  for (uVar37 = 0; uVar38 != uVar37; uVar37 = uVar37 + 1) {
    uVar18 = phi[uVar37];
    uVar35 = (ulong)uVar18;
    uVar6 = puVar16[uVar35 - 0x8000];
    if ((uVar18 == uVar6) || (uVar6 == 0xffff)) {
      pbVar2 = (byte *)((long)(J->cur).ir + uVar35 * 8 + 4);
      *pbVar2 = *pbVar2 & 0xbf;
    }
    else {
      uVar41 = (ulong)((int)uVar39 + 1);
      phi[uVar39] = uVar18;
      pIVar26 = (J->cur).ir;
      uVar39 = uVar41;
      if ((pIVar26[uVar6].field_0.op1 != uVar18) &&
         (*(ushort *)((long)pIVar26 + (ulong)uVar6 * 8 + 2) != uVar18)) {
        pbVar2 = (byte *)((long)pIVar26 + uVar35 * 8 + 4);
        *pbVar2 = *pbVar2 | 0x20;
        bVar12 = true;
      }
    }
  }
  if (bVar12) {
    IVar22 = (J->cur).nins;
LAB_00147620:
    IVar22 = IVar22 - 1;
    if (uVar19 < IVar22) {
      pIVar26 = (J->cur).ir;
      uVar38 = (ulong)IVar22;
      uVar18 = *(ushort *)((long)pIVar26 + uVar38 * 8 + 2);
      if ((short)uVar18 < 0) {
        pbVar2 = (byte *)((long)pIVar26 + (ulong)uVar18 * 8 + 4);
        *pbVar2 = *pbVar2 & 0xdf;
      }
      if ((short)pIVar26[uVar38].field_0.op1 < 0) {
        pbVar2 = (byte *)((long)(J->cur).ir + (ulong)pIVar26[uVar38].field_0.op1 * 8 + 4);
        *pbVar2 = *pbVar2 & 0xdf;
        if ((pIVar26[uVar38].field_0.op1 < uVar19) &&
           ((byte)(*(char *)((long)pIVar26 + uVar38 * 8 + 5) + 0xa1U) < 6)) {
          pIVar26 = (J->cur).ir + pIVar26[uVar38].field_0.op1;
          while ((pIVar26->field_1).o == 'd') {
            if ((short)(pIVar26->field_0).op2 < 0) {
              pbVar2 = (byte *)((long)(J->cur).ir + (ulong)(pIVar26->field_0).op2 * 8 + 4);
              *pbVar2 = *pbVar2 & 0xdf;
            }
            if (-1 < (short)(pIVar26->field_0).op1) break;
            pIVar26 = (J->cur).ir + (pIVar26->field_0).op1;
            (pIVar26->field_1).t.irt = (pIVar26->field_1).t.irt & 0xdf;
          }
        }
      }
      goto LAB_00147620;
    }
    uVar23 = (uint)(J->cur).nsnap;
    while (uVar23 = uVar23 - 1, uVar5 <= uVar23) {
      pSVar40 = (J->cur).snap;
      uVar34 = pSVar40[uVar23].mapofs;
      pSVar10 = (J->cur).snapmap;
      bVar28 = pSVar40[uVar23].nent;
      for (uVar38 = 0; bVar28 != uVar38; uVar38 = uVar38 + 1) {
        uVar18 = (ushort)pSVar10[uVar34 + uVar38];
        if (0x7fff < uVar18) {
          pbVar2 = (byte *)((long)(J->cur).ir + (ulong)uVar18 * 8 + 4);
          *pbVar2 = *pbVar2 & 0xdf;
        }
      }
    }
  }
  BVar8 = J->maxslot;
  BVar9 = J->baseslot;
  uVar38 = 1;
  do {
    uVar39 = uVar39 & 0xffffffff;
    if (BVar8 + BVar9 <= uVar38) {
      while (bVar12) {
        bVar12 = false;
        for (uVar38 = 0; uVar39 != uVar38; uVar38 = uVar38 + 1) {
          pIVar26 = (J->cur).ir;
          if ((*(byte *)((long)pIVar26 + (ulong)phi[uVar38] * 8 + 4) & 0x20) == 0) {
            bVar28 = *(byte *)((long)pIVar26 +
                              (ulong)(ushort)puVar16[(ulong)phi[uVar38] - 0x8000] * 8 + 4);
            if ((bVar28 & 0x20) != 0) {
              *(byte *)((long)pIVar26 + (ulong)(ushort)puVar16[(ulong)phi[uVar38] - 0x8000] * 8 + 4)
                   = bVar28 & 0xdf;
              bVar12 = true;
            }
          }
        }
      }
      for (uVar38 = 0; uVar39 != uVar38; uVar38 = uVar38 + 1) {
        uVar5 = phi[uVar38];
        uVar37 = (ulong)uVar5;
        pIVar26 = (J->cur).ir;
        bVar28 = *(byte *)((long)pIVar26 + uVar37 * 8 + 4);
        if ((bVar28 & 0x20) == 0) {
          uVar18 = puVar16[uVar37 - 0x8000];
          if (uVar19 < uVar18) {
            pbVar2 = (byte *)((long)pIVar26 + (ulong)uVar18 * 8 + 4);
            *pbVar2 = *pbVar2 | 0x40;
            bVar28 = *(byte *)((long)pIVar26 + uVar37 * 8 + 4);
          }
          (J->fold).ins.field_0.ot = bVar28 & 0x1f | 0x1300;
          (J->fold).ins.field_0.op1 = uVar5;
          (J->fold).ins.field_0.op2 = uVar18;
          lj_ir_emit(J);
        }
        else {
          *(byte *)((long)pIVar26 + uVar37 * 8 + 4) = bVar28 & 0x9f;
        }
      }
      return (TValue *)0x0;
    }
    uVar5 = (ushort)J->slot[uVar38];
    while ((uVar23 = (uint)uVar5, 0x7fff < uVar23 &&
           (uVar37 = (ulong)uVar23, uVar23 != (ushort)puVar16[uVar37 - 0x8000]))) {
      pIVar26 = (J->cur).ir;
      bVar28 = *(byte *)((long)pIVar26 + uVar37 * 8 + 4);
      *(byte *)((long)pIVar26 + uVar37 * 8 + 4) = bVar28 & 0xdf;
      if (((bVar28 & 0x40) != 0) || ((bVar28 & 0x1f) < 3)) break;
      *(byte *)((long)pIVar26 + uVar37 * 8 + 4) = bVar28 & 0xdf | 0x40;
      if (0x3f < uVar39) goto LAB_0014786a;
      phi[uVar39] = uVar5;
      uVar39 = uVar39 + 1;
      uVar5 = puVar16[uVar37 - 0x8000];
      if (uVar19 < uVar5) break;
    }
    uVar38 = uVar38 + 1;
  } while( true );
LAB_0014786a:
  e = LJ_TRERR_PHIOV;
LAB_0014786c:
  lj_trace_err(J,e);
}

Assistant:

static TValue *cploop_opt(lua_State *L, lua_CFunction dummy, void *ud)
{
  UNUSED(L); UNUSED(dummy);
  loop_unroll((LoopState *)ud);
  return NULL;
}